

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-event.c
# Opt level: O2

void event_signal_tunnel(game_event_type type,wchar_t nstep,wchar_t npierce,wchar_t ndug,
                        wchar_t dstart,wchar_t dend,_Bool early)

{
  game_event_data local_30;
  
  local_30.tunnel.early = early;
  local_30.point.x = nstep;
  local_30.point.y = npierce;
  local_30.message.type = ndug;
  local_30.bolt.ox = dstart;
  local_30.birthstage.n_choices = dend;
  game_event_dispatch(type,&local_30);
  return;
}

Assistant:

void event_signal_tunnel(game_event_type type, int nstep, int npierce, int ndug,
		int dstart, int dend, bool early)
{
	game_event_data data;

	data.tunnel.nstep = nstep;
	data.tunnel.npierce = npierce;
	data.tunnel.ndug = ndug;
	data.tunnel.dstart = dstart;
	data.tunnel.dend = dend;
	data.tunnel.early = early;
	game_event_dispatch(type, &data);
}